

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double gamln(double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *a_local;
  
  if (*a <= 0.8) {
    dVar1 = gamln1(a);
    dVar2 = log(*a);
    a_local = (double *)(dVar1 - dVar2);
  }
  else if (*a <= 2.25) {
    gamln::t = (*a - 0.5) - 0.5;
    a_local = (double *)gamln1(&gamln::t);
  }
  else if (*a < 10.0) {
    gamln::n = (int)(*a - 1.25);
    gamln::t = *a;
    gamln::w = 1.0;
    for (gamln::i = 1; gamln::i <= gamln::n; gamln::i = gamln::i + 1) {
      gamln::t = gamln::t - 1.0;
      gamln::w = gamln::t * gamln::w;
    }
    gamln::T1 = gamln::t - 1.0;
    dVar1 = gamln1(&gamln::T1);
    dVar2 = log(gamln::w);
    a_local = (double *)(dVar1 + dVar2);
  }
  else {
    gamln::t = pow(1.0 / *a,2.0);
    gamln::w = (((((gamln::c5 * gamln::t + gamln::c4) * gamln::t + gamln::c3) * gamln::t + gamln::c2
                 ) * gamln::t + gamln::c1) * gamln::t + gamln::c0) / *a;
    dVar2 = gamln::d + gamln::w;
    dVar1 = *a;
    dVar3 = log(*a);
    a_local = (double *)((dVar1 - 0.5) * (dVar3 - 1.0) + dVar2);
  }
  gamln::gamln = (double)a_local;
  return (double)a_local;
}

Assistant:

double gamln(double *a)
/*
-----------------------------------------------------------------------
            EVALUATION OF LN(GAMMA(A)) FOR POSITIVE A
-----------------------------------------------------------------------
     WRITTEN BY ALFRED H. MORRIS
          NAVAL SURFACE WARFARE CENTER
          DAHLGREN, VIRGINIA
--------------------------
     D = 0.5*(LN(2*PI) - 1)
--------------------------
*/
{
static double c0 = .833333333333333e-01;
static double c1 = -.277777777760991e-02;
static double c2 = .793650666825390e-03;
static double c3 = -.595202931351870e-03;
static double c4 = .837308034031215e-03;
static double c5 = -.165322962780713e-02;
static double d = .418938533204673e0;
static double gamln,t,w;
static int i,n;
static double T1;
/*
     ..
     .. Executable Statements ..
*/
    if(*a > 0.8e0) goto S10;
    gamln = gamln1(a)-log(*a);
    return gamln;
S10:
    if(*a > 2.25e0) goto S20;
    t = *a-0.5e0-0.5e0;
    gamln = gamln1(&t);
    return gamln;
S20:
    if(*a >= 10.0e0) goto S40;
    n = *a-1.25e0;
    t = *a;
    w = 1.0e0;
    for(i=1; i<=n; i++) {
        t -= 1.0e0;
        w = t*w;
    }
    T1 = t-1.0e0;
    gamln = gamln1(&T1)+log(w);
    return gamln;
S40:
    t = pow(1.0e0/ *a,2.0);
    w = (((((c5*t+c4)*t+c3)*t+c2)*t+c1)*t+c0)/ *a;
    gamln = d+w+(*a-0.5e0)*(log(*a)-1.0e0);
    return gamln;
}